

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddress::setAddress(QHostAddress *this,Q_IPV6ADDR *ip6Addr)

{
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(&this->d);
  QHostAddressPrivate::setAddress((this->d).d.ptr,ip6Addr->c);
  return;
}

Assistant:

void QHostAddress::setAddress(const Q_IPV6ADDR &ip6Addr)
{
    d.detach();
    d->setAddress(ip6Addr);
}